

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

FunctionDeclarationSyntax * __thiscall
slang::parsing::Parser::parseFunctionDeclaration
          (Parser *this,AttrList attributes,SyntaxKind functionKind,TokenKind endKind,
          SyntaxKind parentKind)

{
  Token end_00;
  Token semi_00;
  SyntaxKind parentKind_00;
  bitmask<slang::parsing::detail::FunctionOptions> options;
  FunctionPrototypeSyntax *prototype_00;
  SyntaxNode *this_00;
  FunctionDeclarationSyntax *pFVar1;
  bool bVar2;
  Token TVar3;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> elements;
  Token nameToken_00;
  SyntaxList<slang::syntax::SyntaxNode> local_120;
  size_type local_f0;
  Info *local_e8;
  pointer local_e0;
  size_type local_d8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_d0;
  undefined8 local_a0;
  undefined1 local_98 [16];
  Token nameToken;
  NamedBlockClauseSyntax *endBlockName;
  span<slang::syntax::SyntaxNode_*,_18446744073709551615UL> items;
  Token semi;
  FunctionPrototypeSyntax *prototype;
  undefined1 auStack_40 [7];
  bool isConstructor;
  Token end;
  SyntaxKind parentKind_local;
  TokenKind endKind_local;
  SyntaxKind functionKind_local;
  Parser *this_local;
  AttrList attributes_local;
  
  end.info._4_4_ = parentKind;
  Token::Token((Token *)auStack_40);
  parentKind_00 = end.info._4_4_;
  options = parsing::detail::operator|(AllowImplicitReturn,AllowTasks);
  prototype_00 = parseFunctionPrototype(this,parentKind_00,options,(bool *)((long)&prototype + 7));
  TVar3 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  elements = parseBlockItems(this,endKind,(Token *)auStack_40,(bool)(prototype._7_1_ & 1));
  nameToken.info = (Info *)parseNamedBlockClause(this);
  this_00 = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::operator->(&prototype_00->name);
  nameToken_00 = slang::syntax::SyntaxNode::getLastToken(this_00);
  local_98._8_2_ = nameToken_00.kind;
  unique0x10000234 = nameToken_00;
  if ((local_98._8_2_ == Identifier) || (bVar2 = local_98._8_2_ == NewKeyword, bVar2)) {
    local_98._8_8_ = nameToken_00._0_8_;
    local_a0 = local_98._8_8_;
    nameToken._0_8_ = nameToken_00.info;
    local_98._0_2_ = nameToken.kind;
    local_98[2] = nameToken._2_1_;
    local_98[3] = nameToken.numFlags.raw;
    local_98._4_4_ = nameToken.rawLen;
    checkBlockNames(this,nameToken_00,(NamedBlockClauseSyntax *)nameToken.info);
  }
  local_e0 = attributes.data_;
  local_d8 = attributes.size_;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            (&local_d0,attributes);
  items.size_ = TVar3._0_8_;
  local_f0 = items.size_;
  semi._0_8_ = TVar3.info;
  local_e8 = (Info *)semi._0_8_;
  slang::syntax::SyntaxList<slang::syntax::SyntaxNode>::SyntaxList(&local_120,elements);
  semi_00.info = local_e8;
  semi_00.kind = (undefined2)local_f0;
  semi_00._2_1_ = local_f0._2_1_;
  semi_00.numFlags.raw = local_f0._3_1_;
  semi_00.rawLen = local_f0._4_4_;
  end_00.info = (Info *)end._0_8_;
  end_00.kind = auStack_40._0_2_;
  end_00._2_1_ = auStack_40[2];
  end_00.numFlags.raw = auStack_40[3];
  end_00.rawLen = stack0xffffffffffffffc4;
  pFVar1 = slang::syntax::SyntaxFactory::functionDeclaration
                     (&this->factory,functionKind,&local_d0,prototype_00,semi_00,&local_120,end_00,
                      (NamedBlockClauseSyntax *)nameToken.info);
  return pFVar1;
}

Assistant:

FunctionDeclarationSyntax& Parser::parseFunctionDeclaration(AttrList attributes,
                                                            SyntaxKind functionKind,
                                                            TokenKind endKind,
                                                            SyntaxKind parentKind) {
    Token end;
    bool isConstructor;
    auto& prototype = parseFunctionPrototype(parentKind,
                                             FunctionOptions::AllowImplicitReturn |
                                                 FunctionOptions::AllowTasks,
                                             &isConstructor);

    auto semi = expect(TokenKind::Semicolon);
    auto items = parseBlockItems(endKind, end, isConstructor);
    auto endBlockName = parseNamedBlockClause();

    Token nameToken = prototype.name->getLastToken();
    if (nameToken.kind == TokenKind::Identifier || nameToken.kind == TokenKind::NewKeyword)
        checkBlockNames(nameToken, endBlockName);

    return factory.functionDeclaration(functionKind, attributes, prototype, semi, items, end,
                                       endBlockName);
}